

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>::int_writer<int,_fmt::v5::basic_format_specs<wchar_t>_>::num_writer>
          *f)

{
  wchar_t wVar1;
  ulong uVar2;
  wchar_t *pwVar3;
  wchar_t __tmp;
  wchar_t wVar4;
  ulong uVar5;
  wchar_t wVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar10 = (ulong)spec->width_;
  uVar7 = f->size_;
  lVar11 = uVar7 - uVar10;
  if (uVar10 <= uVar7) {
LAB_001fd789:
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
                  *)f,(truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)this);
    return;
  }
  wVar1 = spec->fill_;
  uVar13 = uVar10 - uVar7;
  if (spec->align_ == ALIGN_CENTER) {
    uVar12 = uVar13 >> 1;
    pwVar3 = *(wchar_t **)this;
    uVar2 = *(ulong *)(this + 8);
    uVar5 = *(ulong *)(this + 0x10);
    wVar6 = *(wchar_t *)(this + 0x18);
    uVar8 = uVar5;
    uVar9 = uVar12;
    if (1 < uVar13) {
      do {
        wVar4 = wVar1;
        if (uVar8 < uVar2) {
          *pwVar3 = wVar1;
          pwVar3 = pwVar3 + 1;
          wVar4 = wVar6;
        }
        wVar6 = wVar4;
        uVar9 = uVar9 - 1;
        uVar8 = uVar8 + 1;
      } while (uVar9 != 0);
      uVar5 = uVar5 + uVar12;
    }
    *(wchar_t **)this = pwVar3;
    *(ulong *)(this + 8) = uVar2;
    *(ulong *)(this + 0x10) = uVar5;
    *(wchar_t *)(this + 0x18) = wVar6;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
                  *)f,(truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)this);
    pwVar3 = *(wchar_t **)this;
    uVar2 = *(ulong *)(this + 8);
    uVar5 = *(ulong *)(this + 0x10);
    wVar6 = *(wchar_t *)(this + 0x18);
    uVar13 = uVar13 - uVar12;
    if (uVar13 == 0) goto LAB_001fd865;
    lVar11 = (uVar7 + uVar12) - uVar10;
    uVar7 = uVar5;
    do {
      wVar4 = wVar1;
      if (uVar7 < uVar2) {
        *pwVar3 = wVar1;
        pwVar3 = pwVar3 + 1;
        wVar4 = wVar6;
      }
      wVar6 = wVar4;
      uVar7 = uVar7 + 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pwVar3 = *(wchar_t **)this;
      uVar2 = *(ulong *)(this + 8);
      uVar5 = *(ulong *)(this + 0x10);
      wVar6 = *(wchar_t *)(this + 0x18);
      if (uVar13 != 0) {
        lVar11 = uVar7 - uVar10;
        uVar7 = uVar5;
        do {
          wVar4 = wVar1;
          if (uVar7 < uVar2) {
            *pwVar3 = wVar1;
            pwVar3 = pwVar3 + 1;
            wVar4 = wVar6;
          }
          wVar6 = wVar4;
          uVar7 = uVar7 + 1;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0);
        uVar5 = uVar5 + uVar13;
      }
      *(wchar_t **)this = pwVar3;
      *(ulong *)(this + 8) = uVar2;
      *(ulong *)(this + 0x10) = uVar5;
      *(wchar_t *)(this + 0x18) = wVar6;
      goto LAB_001fd789;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
                  *)f,(truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)this);
    pwVar3 = *(wchar_t **)this;
    uVar2 = *(ulong *)(this + 8);
    uVar5 = *(ulong *)(this + 0x10);
    wVar6 = *(wchar_t *)(this + 0x18);
    uVar7 = uVar5;
    wVar4 = wVar6;
    if (uVar13 == 0) goto LAB_001fd865;
    do {
      wVar6 = wVar1;
      if (uVar7 < uVar2) {
        *pwVar3 = wVar1;
        pwVar3 = pwVar3 + 1;
        wVar6 = wVar4;
      }
      lVar11 = lVar11 + 1;
      uVar7 = uVar7 + 1;
      wVar4 = wVar6;
    } while (lVar11 != 0);
  }
  uVar5 = uVar5 + uVar13;
LAB_001fd865:
  *(wchar_t **)this = pwVar3;
  *(ulong *)(this + 8) = uVar2;
  *(ulong *)(this + 0x10) = uVar5;
  *(wchar_t *)(this + 0x18) = wVar6;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }